

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

streamsize __thiscall
fmt::v6::internal::formatbuf<char>::xsputn(formatbuf<char> *this,char *s,streamsize count)

{
  streamsize in_RDX;
  char *in_stack_00000018;
  buffer<char> *in_stack_00000020;
  
  buffer<char>::append<char>(in_stack_00000020,in_stack_00000018,(char *)this);
  return in_RDX;
}

Assistant:

std::streamsize xsputn(const Char* s, std::streamsize count) FMT_OVERRIDE {
    buffer_.append(s, s + count);
    return count;
  }